

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_NVector_MultiFab.cpp
# Opt level: O0

N_Vector N_VNewEmpty_MultiFab(sunindextype length)

{
  N_Vector_Ops __ptr;
  undefined4 *puVar1;
  undefined4 in_EDI;
  N_VectorContent_MultiFab content;
  N_Vector_Ops ops;
  N_Vector v;
  N_Vector local_8;
  
  local_8 = (N_Vector)malloc(0x18);
  if (local_8 == (N_Vector)0x0) {
    local_8 = (N_Vector)0x0;
  }
  else {
    __ptr = (N_Vector_Ops)malloc(0x1b8);
    if (__ptr == (N_Vector_Ops)0x0) {
      free(local_8);
      local_8 = (N_Vector)0x0;
    }
    else {
      __ptr->nvgetvectorid = (_func_N_Vector_ID_N_Vector *)0x0;
      __ptr->nvclone = N_VClone_MultiFab;
      __ptr->nvcloneempty = N_VCloneEmpty_MultiFab;
      __ptr->nvdestroy = N_VDestroy_MultiFab;
      __ptr->nvspace = N_VSpace_MultiFab;
      __ptr->nvgetarraypointer = (_func_realtype_ptr_N_Vector *)0x0;
      __ptr->nvsetarraypointer = (_func_void_realtype_ptr_N_Vector *)0x0;
      __ptr->nvgetlength = N_VGetLength_MultiFab;
      __ptr->nvlinearsum = N_VLinearSum_MultiFab;
      __ptr->nvconst = N_VConst_MultiFab;
      __ptr->nvprod = N_VProd_MultiFab;
      __ptr->nvdiv = N_VDiv_MultiFab;
      __ptr->nvscale = N_VScale_MultiFab;
      __ptr->nvabs = N_VAbs_MultiFab;
      __ptr->nvinv = N_VInv_MultiFab;
      __ptr->nvaddconst = N_VAddConst_MultiFab;
      __ptr->nvdotprod = N_VDotProd_MultiFab;
      __ptr->nvmaxnorm = N_VMaxNorm_MultiFab;
      __ptr->nvwrmsnormmask = N_VWrmsNormMask_MultiFab;
      __ptr->nvwrmsnorm = N_VWrmsNorm_MultiFab;
      __ptr->nvmin = N_VMin_MultiFab;
      __ptr->nvwl2norm = N_VWL2Norm_MultiFab;
      __ptr->nvl1norm = N_VL1Norm_MultiFab;
      __ptr->nvcompare = N_VCompare_MultiFab;
      __ptr->nvinvtest = N_VInvTest_MultiFab;
      __ptr->nvconstrmask = N_VConstrMask_MultiFab;
      __ptr->nvminquotient = N_VMinQuotient_MultiFab;
      __ptr->nvlinearcombination = (_func_int_int_realtype_ptr_N_Vector_ptr_N_Vector *)0x0;
      __ptr->nvscaleaddmulti = (_func_int_int_realtype_ptr_N_Vector_N_Vector_ptr_N_Vector_ptr *)0x0;
      __ptr->nvdotprodmulti = (_func_int_int_N_Vector_N_Vector_ptr_realtype_ptr *)0x0;
      __ptr->nvlinearsumvectorarray =
           (_func_int_int_realtype_N_Vector_ptr_realtype_N_Vector_ptr_N_Vector_ptr *)0x0;
      __ptr->nvscalevectorarray = (_func_int_int_realtype_ptr_N_Vector_ptr_N_Vector_ptr *)0x0;
      __ptr->nvconstvectorarray = (_func_int_int_realtype_N_Vector_ptr *)0x0;
      __ptr->nvwrmsnormvectorarray = (_func_int_int_N_Vector_ptr_N_Vector_ptr_realtype_ptr *)0x0;
      __ptr->nvwrmsnormmaskvectorarray =
           (_func_int_int_N_Vector_ptr_N_Vector_ptr_N_Vector_realtype_ptr *)0x0;
      __ptr->nvscaleaddmultivectorarray =
           (_func_int_int_int_realtype_ptr_N_Vector_ptr_N_Vector_ptr_ptr_N_Vector_ptr_ptr *)0x0;
      __ptr->nvlinearcombinationvectorarray =
           (_func_int_int_int_realtype_ptr_N_Vector_ptr_ptr_N_Vector_ptr *)0x0;
      puVar1 = (undefined4 *)malloc(0x10);
      if (puVar1 == (undefined4 *)0x0) {
        free(__ptr);
        free(local_8);
        local_8 = (N_Vector)0x0;
      }
      else {
        *puVar1 = in_EDI;
        puVar1[1] = 0;
        *(undefined8 *)(puVar1 + 2) = 0;
        local_8->content = puVar1;
        local_8->ops = __ptr;
      }
    }
  }
  return local_8;
}

Assistant:

N_Vector N_VNewEmpty_MultiFab(sunindextype length)
{
    N_Vector v;
    N_Vector_Ops ops;
    N_VectorContent_MultiFab content;

    /* Create vector */
    v = NULL;
    v = (N_Vector) malloc(sizeof *v);
    if (v == NULL) return(NULL);

    /* Create vector operation structure */
    ops = NULL;
    ops = (N_Vector_Ops) malloc(sizeof *ops);
    if (ops == NULL) { free(v); return(NULL); }

    ops->nvgetvectorid     = NULL;
    ops->nvclone           = N_VClone_MultiFab;
    ops->nvcloneempty      = N_VCloneEmpty_MultiFab;
    ops->nvdestroy         = N_VDestroy_MultiFab;
    ops->nvspace           = N_VSpace_MultiFab;
    ops->nvgetarraypointer = NULL;
    ops->nvsetarraypointer = NULL;
    ops->nvgetlength       = N_VGetLength_MultiFab;

    /* standard vector operations */
    ops->nvlinearsum    = N_VLinearSum_MultiFab;
    ops->nvconst        = N_VConst_MultiFab;
    ops->nvprod         = N_VProd_MultiFab;
    ops->nvdiv          = N_VDiv_MultiFab;
    ops->nvscale        = N_VScale_MultiFab;
    ops->nvabs          = N_VAbs_MultiFab;
    ops->nvinv          = N_VInv_MultiFab;
    ops->nvaddconst     = N_VAddConst_MultiFab;
    ops->nvdotprod      = N_VDotProd_MultiFab;
    ops->nvmaxnorm      = N_VMaxNorm_MultiFab;
    ops->nvwrmsnormmask = N_VWrmsNormMask_MultiFab;
    ops->nvwrmsnorm     = N_VWrmsNorm_MultiFab;
    ops->nvmin          = N_VMin_MultiFab;
    ops->nvwl2norm      = N_VWL2Norm_MultiFab;
    ops->nvl1norm       = N_VL1Norm_MultiFab;
    ops->nvcompare      = N_VCompare_MultiFab;
    ops->nvinvtest      = N_VInvTest_MultiFab;
    ops->nvconstrmask   = N_VConstrMask_MultiFab;
    ops->nvminquotient  = N_VMinQuotient_MultiFab;

    /* fused vector operations (optional, NULL means disabled by default) */
    ops->nvlinearcombination = NULL;
    ops->nvscaleaddmulti     = NULL;
    ops->nvdotprodmulti      = NULL;

    /* vector array operations (optional, NULL means disabled by default) */
    ops->nvlinearsumvectorarray         = NULL;
    ops->nvscalevectorarray             = NULL;
    ops->nvconstvectorarray             = NULL;
    ops->nvwrmsnormvectorarray          = NULL;
    ops->nvwrmsnormmaskvectorarray      = NULL;
    ops->nvscaleaddmultivectorarray     = NULL;
    ops->nvlinearcombinationvectorarray = NULL;

    /* Create content */
    content = NULL;
    content = (N_VectorContent_MultiFab) malloc(sizeof *content);
    if (content == NULL) { free(ops); free(v); return(NULL); }

    content->length = length;
    content->own_mf = SUNFALSE;
    content->mf     = NULL;

    /* Attach content and ops */
    v->content = content;
    v->ops     = ops;

    return(v);
}